

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_load_configuration_test.cpp
# Opt level: O3

void __thiscall
metacall_load_configuration_test_DefaultConstructor_Test::TestBody
          (metacall_load_configuration_test_DefaultConstructor_Test *this)

{
  undefined8 *puVar1;
  AssertHelperData *pAVar2;
  pointer *__ptr;
  char *pcVar3;
  metacall_allocator_std_type std_ctx;
  AssertHelper local_58;
  AssertHelper local_50;
  Message local_48;
  undefined8 *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  code *local_28;
  
  metacall_print_info();
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_58.data_._0_4_ = metacall_initialize();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"(int)0","(int)metacall_initialize()",(int *)&local_48,
             (int *)&local_58);
  if (local_38._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_48);
    if ((undefined8 *)CONCAT44(uStack_2c,uStack_30) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_2c,uStack_30);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_load_configuration_test/source/metacall_load_configuration_test.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)CONCAT44(local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar1 = (undefined8 *)CONCAT44(uStack_2c,uStack_30);
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  if (local_38._0_1_ != (internal)0x0) {
    local_28 = free;
    local_38 = 0x14c3d8;
    uStack_34 = 0;
    uStack_30 = 0x14c4e0;
    uStack_2c = 0;
    pAVar2 = (AssertHelperData *)metacall_allocator_create(0);
    local_58.data_ = (AssertHelperData *)0x0;
    local_50.data_ = pAVar2;
    testing::internal::CmpHelperNE<void*,void*>
              ((internal *)&local_48,"(void *)__null","(void *)config_allocator",&local_58.data_,
               &local_50.data_);
    if (local_48.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_40 == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (char *)*local_40;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_load_configuration_test/source/metacall_load_configuration_test.cpp"
                 ,0x29,pcVar3);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_58.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
      if (local_40 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_40 != local_40 + 2) {
          operator_delete((undefined8 *)*local_40);
        }
        operator_delete(local_40);
      }
    }
    else {
      if (local_40 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_40 != local_40 + 2) {
          operator_delete((undefined8 *)*local_40);
        }
        operator_delete(local_40);
      }
      metacall_allocator_destroy(pAVar2);
      metacall_destroy();
    }
  }
  return;
}

Assistant:

TEST_F(metacall_load_configuration_test, DefaultConstructor)
{
	metacall_print_info();

	ASSERT_EQ((int)0, (int)metacall_initialize());

	struct metacall_allocator_std_type std_ctx = { &std::malloc, &std::realloc, &std::free };

	void *config_allocator = metacall_allocator_create(METACALL_ALLOCATOR_STD, (void *)&std_ctx);

	ASSERT_NE((void *)NULL, (void *)config_allocator);

/* Python */
#if defined(OPTION_BUILD_LOADERS_PY)
	{
		const long seven_multiples_limit = 10;

		long iterator;

		void *ret = NULL;

		ASSERT_EQ((int)0, (int)metacall_load_from_configuration("metacall_load_from_configuration_py_test_a.json", NULL, config_allocator));

		ret = metacall("multiply", 5, 15);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)75);

		metacall_value_destroy(ret);

		for (iterator = 0; iterator <= seven_multiples_limit; ++iterator)
		{
			ret = metacall("multiply", 7, iterator);

			EXPECT_NE((void *)NULL, (void *)ret);

			EXPECT_EQ((long)metacall_value_to_long(ret), (long)(7 * iterator));

			metacall_value_destroy(ret);
		}

		ret = metacall("divide", 64.0, 2.0);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)32.0);

		metacall_value_destroy(ret);

		ret = metacall("sum", 1000, 3500);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)4500);

		metacall_value_destroy(ret);

		ret = metacall("sum", 3, 4);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)7);

		metacall_value_destroy(ret);

		ret = metacall("hello");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((enum metacall_value_id)METACALL_NULL, (enum metacall_value_id)metacall_value_id(ret));

		EXPECT_EQ((void *)NULL, (void *)metacall_value_to_null(ret));

		metacall_value_destroy(ret);

		ret = metacall("strcat", "Hello ", "Universe");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "Hello Universe"));

		metacall_value_destroy(ret);

		ASSERT_EQ((int)0, (int)metacall_load_from_configuration("metacall_load_from_configuration_py_test_b.json", NULL, config_allocator));

		/* Print inspect information */
		{
			size_t size = 0;

			struct metacall_allocator_std_type std_ctx = { &std::malloc, &std::realloc, &std::free };

			void *allocator = metacall_allocator_create(METACALL_ALLOCATOR_STD, (void *)&std_ctx);

			char *inspect_str = metacall_inspect(&size, allocator);

			EXPECT_NE((char *)NULL, (char *)inspect_str);

			EXPECT_GT((size_t)size, (size_t)0);

			std::cout << inspect_str << std::endl;

			metacall_allocator_free(allocator, inspect_str);

			metacall_allocator_destroy(allocator);
		}

		ret = metacall("s_multiply", 5, 15);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)75);

		metacall_value_destroy(ret);

		for (iterator = 0; iterator <= seven_multiples_limit; ++iterator)
		{
			ret = metacall("s_multiply", 7, iterator);

			EXPECT_NE((void *)NULL, (void *)ret);

			EXPECT_EQ((long)metacall_value_to_long(ret), (long)(7 * iterator));

			metacall_value_destroy(ret);
		}

		ret = metacall("s_divide", 64.0, 2.0);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)32.0);

		metacall_value_destroy(ret);

		ret = metacall("s_sum", 1000, 3500);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)4500);

		metacall_value_destroy(ret);

		ret = metacall("s_sum", 3, 4);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)7);

		metacall_value_destroy(ret);

		ret = metacall("s_hello");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((enum metacall_value_id)METACALL_NULL, (enum metacall_value_id)metacall_value_id(ret));

		EXPECT_EQ((void *)NULL, (void *)metacall_value_to_null(ret));

		metacall_value_destroy(ret);

		ret = metacall("s_strcat", "Hello ", "Universe");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "Hello Universe"));

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_PY */

/* Ruby */
#if defined(OPTION_BUILD_LOADERS_RB)
	{
		void *ret = NULL;

		ASSERT_EQ((int)0, (int)metacall_load_from_configuration("metacall_load_from_configuration_rb_test.json", NULL, config_allocator));

		ret = metacall("say_multiply", 5, 7);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)metacall_value_to_int(ret), (int)35);

		metacall_value_destroy(ret);

		ret = metacall("say_null");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((enum metacall_value_id)METACALL_NULL, (enum metacall_value_id)metacall_value_id(ret));

		metacall_value_destroy(ret);

		ret = metacall("say_hello", "meta-programmer");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "Hello meta-programmer!"));

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_RB */

/* NodeJS */
#if defined(OPTION_BUILD_LOADERS_NODE)
	{
		const enum metacall_value_id hello_boy_double_ids[] = {
			METACALL_DOUBLE, METACALL_DOUBLE
		};

		void *ret = NULL;

		ASSERT_EQ((int)0, (int)metacall_load_from_configuration("metacall_load_from_configuration_node_test.json", NULL, config_allocator));

		ret = metacallt("hello_boy", hello_boy_double_ids, 3.0, 4.0);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)7.0);

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_NODE */

	metacall_allocator_destroy(config_allocator);

	metacall_destroy();
}